

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void rgb_565_to_argb_1555
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  short *psVar1;
  short *psVar2;
  ushort *puVar3;
  int iVar4;
  
  if (0 < height) {
    psVar2 = (short *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
    puVar3 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
    iVar4 = 0;
    do {
      if (0 < width) {
        psVar1 = psVar2 + width;
        do {
          *psVar2 = (*puVar3 >> 1 & 0xffe0) + (*puVar3 & 0x1f) + -0x8000;
          psVar2 = psVar2 + 1;
          puVar3 = puVar3 + 1;
        } while (psVar2 < psVar1);
      }
      puVar3 = puVar3 + (src_pitch / 2 - width);
      psVar2 = psVar2 + (dst_pitch / 2 - width);
      iVar4 = iVar4 + 1;
    } while (iVar4 != height);
  }
  return;
}

Assistant:

static void rgb_565_to_argb_1555(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGB_565_TO_ARGB_1555(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}